

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::ResolveLinkerWrapper
          (cmGeneratorTarget *this,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *result,string *language,bool joinItems)

{
  cmMakefile *pcVar1;
  pointer pBVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  iterator __position;
  cmake *this_00;
  char *pcVar7;
  long lVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __it;
  __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __position_00;
  long lVar10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it_00;
  string_view arg;
  string_view str;
  string_view separator;
  string_view sep;
  bool local_1e0;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkerOptions;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_190;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  wrapperFlag;
  string LINKER;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_108;
  cmListFileBacktrace local_f8;
  string wrapperSep;
  cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_c8;
  string LINKER_SHELL;
  string SHELL;
  string wrapper;
  string local_50;
  
  pcVar1 = this->Makefile;
  std::operator+(&wrapperSep,"CMAKE_",language);
  pcVar7 = "_LINKER_WRAPPER_FLAG";
  if (this->DeviceLink != false) {
    pcVar7 = "_DEVICE_LINKER_WRAPPER_FLAG";
  }
  std::operator+(&local_190.Value,&wrapperSep,pcVar7);
  psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&local_190.Value);
  std::__cxx11::string::string((string *)&wrapper,(string *)psVar6);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&wrapperSep);
  arg._M_str = wrapper._M_dataplus._M_p;
  arg._M_len = wrapper._M_string_length;
  cmExpandedList_abi_cxx11_(&wrapperFlag,arg,false);
  pcVar1 = this->Makefile;
  std::operator+(&LINKER,"CMAKE_",language);
  pcVar7 = "_LINKER_WRAPPER_FLAG_SEP";
  if (this->DeviceLink != false) {
    pcVar7 = "_DEVICE_LINKER_WRAPPER_FLAG_SEP";
  }
  std::operator+(&local_190.Value,&LINKER,pcVar7);
  psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&local_190.Value);
  std::__cxx11::string::string((string *)&wrapperSep,(string *)psVar6);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&LINKER);
  local_1e0 = true;
  if ((wrapperFlag.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       wrapperFlag.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (bVar4 = std::operator==(wrapperFlag.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + -1," "), bVar4)) {
    wrapperFlag.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         wrapperFlag.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    std::__cxx11::string::~string
              ((string *)
               wrapperFlag.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    local_1e0 = false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&LINKER,"LINKER:",(allocator<char> *)&local_190);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&SHELL,"SHELL:",(allocator<char> *)&local_190);
  std::operator+(&LINKER_SHELL,&LINKER,&SHELL);
  do {
    __it._M_current =
         (result->
         super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    pBVar2 = (result->
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_190.Value._M_dataplus._M_p = (pointer)&LINKER;
    lVar10 = (long)pBVar2 - (long)__it._M_current;
    for (lVar8 = lVar10 / 0x30 >> 2; 0 < lVar8; lVar8 = lVar8 + -1) {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::$_0>
              ::operator()((_Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::__0>
                            *)&local_190,__it);
      __position_00._M_current = __it._M_current;
      if (bVar4) goto LAB_0034367b;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::$_0>
              ::operator()((_Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::__0>
                            *)&local_190,__it._M_current + 1);
      __position_00._M_current = __it._M_current + 1;
      if (bVar4) goto LAB_0034367b;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::$_0>
              ::operator()((_Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::__0>
                            *)&local_190,__it._M_current + 2);
      __position_00._M_current = __it._M_current + 2;
      if (bVar4) goto LAB_0034367b;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::$_0>
              ::operator()((_Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::__0>
                            *)&local_190,__it._M_current + 3);
      __position_00._M_current = __it._M_current + 3;
      if (bVar4) goto LAB_0034367b;
      __it._M_current = __it._M_current + 4;
      lVar10 = lVar10 + -0xc0;
    }
    lVar10 = lVar10 / 0x30;
    if (lVar10 == 1) {
LAB_003439f5:
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::$_0>
              ::operator()((_Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::__0>
                            *)&local_190,__it);
      __position_00._M_current = pBVar2;
      if (bVar4) {
        __position_00._M_current = __it._M_current;
      }
    }
    else if (lVar10 == 2) {
LAB_00343658:
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::$_0>
              ::operator()((_Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::__0>
                            *)&local_190,__it);
      __position_00._M_current = __it._M_current;
      if (!bVar4) {
        __it._M_current = __it._M_current + 1;
        goto LAB_003439f5;
      }
    }
    else {
      __position_00._M_current = pBVar2;
      if ((lVar10 == 3) &&
         (bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::$_0>
                  ::operator()((_Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::__0>
                                *)&local_190,__it), __position_00._M_current = __it._M_current,
         !bVar4)) {
        __it._M_current = __it._M_current + 1;
        goto LAB_00343658;
      }
    }
LAB_0034367b:
    if (__position_00._M_current ==
        (result->
        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) break;
    std::__cxx11::string::string((string *)&value,(string *)__position_00._M_current);
    local_f8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = ((__position_00._M_current)->Backtrace).
              super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    local_f8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         ((__position_00._M_current)->Backtrace).
         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    ((__position_00._M_current)->Backtrace).
    super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ((__position_00._M_current)->Backtrace).
    super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    __position = std::
                 vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::erase(result,__position_00._M_current);
    linkerOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    linkerOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    linkerOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar5 = std::__cxx11::string::compare((ulong)&value,0,(string *)LINKER_SHELL._M_string_length);
    if (iVar5 == 0) {
      cmSystemTools::ParseUnixCommandLine
                (value._M_dataplus._M_p + LINKER_SHELL._M_string_length,&linkerOptions);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_190,(ulong)&value);
      str._M_str = local_190.Value._M_dataplus._M_p;
      str._M_len = local_190.Value._M_string_length;
      sep._M_str = ",";
      sep._M_len = 1;
      cmTokenize_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&options,str,sep);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&linkerOptions,&options);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&options);
      std::__cxx11::string::~string((string *)&local_190);
    }
    pbVar3 = linkerOptions.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((linkerOptions.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         linkerOptions.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       ((lVar10 = (long)linkerOptions.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)linkerOptions.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start, lVar10 == 0x20 &&
        ((linkerOptions.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 0)))) {
      bVar4 = false;
    }
    else {
      local_190.Value._M_dataplus._M_p = (pointer)&SHELL;
      __it_00._M_current =
           linkerOptions.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      for (lVar8 = lVar10 >> 7; _Var9._M_current = __it_00._M_current, 0 < lVar8; lVar8 = lVar8 + -1
          ) {
        bVar4 = __gnu_cxx::__ops::
                _Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::$_1>
                ::operator()((_Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::__1>
                              *)&local_190,__it_00);
        if (bVar4) goto LAB_0034385c;
        bVar4 = __gnu_cxx::__ops::
                _Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::$_1>
                ::operator()((_Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::__1>
                              *)&local_190,__it_00._M_current + 1);
        _Var9._M_current = __it_00._M_current + 1;
        if (bVar4) goto LAB_0034385c;
        bVar4 = __gnu_cxx::__ops::
                _Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::$_1>
                ::operator()((_Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::__1>
                              *)&local_190,__it_00._M_current + 2);
        _Var9._M_current = __it_00._M_current + 2;
        if (bVar4) goto LAB_0034385c;
        bVar4 = __gnu_cxx::__ops::
                _Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::$_1>
                ::operator()((_Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::__1>
                              *)&local_190,__it_00._M_current + 3);
        _Var9._M_current = __it_00._M_current + 3;
        if (bVar4) goto LAB_0034385c;
        __it_00._M_current = __it_00._M_current + 4;
        lVar10 = lVar10 + -0x80;
      }
      lVar10 = lVar10 >> 5;
      if (lVar10 == 1) {
LAB_00343a47:
        bVar4 = __gnu_cxx::__ops::
                _Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::$_1>
                ::operator()((_Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::__1>
                              *)&local_190,__it_00);
        _Var9._M_current = pbVar3;
        if (bVar4) {
          _Var9._M_current = __it_00._M_current;
        }
      }
      else if (lVar10 == 2) {
LAB_00343a13:
        bVar4 = __gnu_cxx::__ops::
                _Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::$_1>
                ::operator()((_Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::__1>
                              *)&local_190,_Var9);
        if (!bVar4) {
          __it_00._M_current = _Var9._M_current + 1;
          goto LAB_00343a47;
        }
      }
      else {
        _Var9._M_current = pbVar3;
        if ((lVar10 == 3) &&
           (bVar4 = __gnu_cxx::__ops::
                    _Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::$_1>
                    ::operator()((_Iter_pred<cmGeneratorTarget::ResolveLinkerWrapper(std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&,std::__cxx11::string_const&,bool)const::__1>
                                  *)&local_190,__it_00), _Var9._M_current = __it_00._M_current,
           !bVar4)) {
          _Var9._M_current = __it_00._M_current + 1;
          goto LAB_00343a13;
        }
      }
LAB_0034385c:
      if (_Var9._M_current ==
          linkerOptions.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        anon_unknown.dwarf_1082924::wrapOptions
                  (&options,&linkerOptions,&local_f8,&wrapperFlag,&wrapperSep,local_1e0);
        if (joinItems) {
          local_c8.Begin._M_current =
               options.
               super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_c8.End._M_current =
               options.
               super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          separator._M_str = " ";
          separator._M_len = 1;
          cmJoin<cmRange<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>>
                    (&local_50,&local_c8,separator);
          local_108.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_108.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_108);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                    (&local_190,&local_50,(cmListFileBacktrace *)&local_108);
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_insert_rval(result,(const_iterator)__position._M_current,&local_190);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                    (&local_190);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_108.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          std::__cxx11::string::~string((string *)&local_50);
        }
        else {
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          insert<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>,void>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     result,(const_iterator)__position._M_current,
                     (__normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      )options.
                       super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      )options.
                       super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
        }
        std::
        vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&options);
        bVar4 = false;
      }
      else {
        this_00 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_190,
                   "\'SHELL:\' prefix is not supported as part of \'LINKER:\' arguments.",
                   (allocator<char> *)&local_c8);
        GetBacktrace((cmGeneratorTarget *)&options);
        cmake::IssueMessage(this_00,FATAL_ERROR,&local_190.Value,(cmListFileBacktrace *)&options);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &options.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        std::__cxx11::string::~string((string *)&local_190);
        bVar4 = true;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&linkerOptions);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_f8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::~string((string *)&value);
  } while (!bVar4);
  std::__cxx11::string::~string((string *)&LINKER_SHELL);
  std::__cxx11::string::~string((string *)&SHELL);
  std::__cxx11::string::~string((string *)&LINKER);
  std::__cxx11::string::~string((string *)&wrapperSep);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&wrapperFlag);
  std::__cxx11::string::~string((string *)&wrapper);
  return result;
}

Assistant:

std::vector<BT<std::string>>& cmGeneratorTarget::ResolveLinkerWrapper(
  std::vector<BT<std::string>>& result, const std::string& language,
  bool joinItems) const
{
  // replace "LINKER:" prefixed elements by actual linker wrapper
  const std::string wrapper(this->Makefile->GetSafeDefinition(
    "CMAKE_" + language +
    (this->IsDeviceLink() ? "_DEVICE_LINKER_WRAPPER_FLAG"
                          : "_LINKER_WRAPPER_FLAG")));
  std::vector<std::string> wrapperFlag = cmExpandedList(wrapper);
  const std::string wrapperSep(this->Makefile->GetSafeDefinition(
    "CMAKE_" + language +
    (this->IsDeviceLink() ? "_DEVICE_LINKER_WRAPPER_FLAG_SEP"
                          : "_LINKER_WRAPPER_FLAG_SEP")));
  bool concatFlagAndArgs = true;
  if (!wrapperFlag.empty() && wrapperFlag.back() == " ") {
    concatFlagAndArgs = false;
    wrapperFlag.pop_back();
  }

  const std::string LINKER{ "LINKER:" };
  const std::string SHELL{ "SHELL:" };
  const std::string LINKER_SHELL = LINKER + SHELL;

  std::vector<BT<std::string>>::iterator entry;
  while ((entry = std::find_if(result.begin(), result.end(),
                               [&LINKER](BT<std::string> const& item) -> bool {
                                 return item.Value.compare(0, LINKER.length(),
                                                           LINKER) == 0;
                               })) != result.end()) {
    std::string value = std::move(entry->Value);
    cmListFileBacktrace bt = std::move(entry->Backtrace);
    entry = result.erase(entry);

    std::vector<std::string> linkerOptions;
    if (value.compare(0, LINKER_SHELL.length(), LINKER_SHELL) == 0) {
      cmSystemTools::ParseUnixCommandLine(
        value.c_str() + LINKER_SHELL.length(), linkerOptions);
    } else {
      linkerOptions = cmTokenize(value.substr(LINKER.length()), ",");
    }

    if (linkerOptions.empty() ||
        (linkerOptions.size() == 1 && linkerOptions.front().empty())) {
      continue;
    }

    // for now, raise an error if prefix SHELL: is part of arguments
    if (std::find_if(linkerOptions.begin(), linkerOptions.end(),
                     [&SHELL](const std::string& item) -> bool {
                       return item.find(SHELL) != std::string::npos;
                     }) != linkerOptions.end()) {
      this->LocalGenerator->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR,
        "'SHELL:' prefix is not supported as part of 'LINKER:' arguments.",
        this->GetBacktrace());
      return result;
    }

    std::vector<BT<std::string>> options = wrapOptions(
      linkerOptions, bt, wrapperFlag, wrapperSep, concatFlagAndArgs);
    if (joinItems) {
      result.insert(entry,
                    cmJoin(cmRange<decltype(options.cbegin())>(
                             options.cbegin(), options.cend()),
                           " "_s));
    } else {
      result.insert(entry, options.begin(), options.end());
    }
  }
  return result;
}